

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  ImFont **ppIVar1;
  int local_14;
  int i;
  ImFontAtlas *this_local;
  
  if ((this->Locked & 1U) != 0) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x633,"void ImFontAtlas::ClearFonts()");
  }
  for (local_14 = 0; local_14 < (this->Fonts).Size; local_14 = local_14 + 1) {
    ppIVar1 = ImVector<ImFont_*>::operator[](&this->Fonts,local_14);
    IM_DELETE<ImFont>(*ppIVar1);
  }
  ImVector<ImFont_*>::clear(&this->Fonts);
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}